

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_SclPerformBuffering_rec(Abc_Obj_t *pObj,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *vNodes;
  int local_3c;
  int nOldFanNum;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pBuffer;
  Vec_Ptr_t *vFanouts;
  int fVerbose_local;
  int fUseInvs_local;
  int Degree_local;
  int DegreeR_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
    iVar1 = Abc_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pObj);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 == 0)) {
        __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclBuffer.c"
                      ,0x1af,"void Abc_SclPerformBuffering_rec(Abc_Obj_t *, int, int, int, int)");
      }
      for (local_3c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_3c < iVar1; local_3c = local_3c + 1)
      {
        pAVar3 = Abc_ObjFanout(pObj,local_3c);
        Abc_SclPerformBuffering_rec(pAVar3,DegreeR,Degree,fUseInvs,fVerbose);
      }
      iVar1 = Abc_ObjFanoutNum(pObj);
      while (iVar2 = Abc_ObjFanoutNum(pObj), Degree < iVar2) {
        Abc_SclPerformBufferingOne(pObj,Degree,fUseInvs,fVerbose);
      }
      if ((DegreeR != 0) && (DegreeR < iVar1)) {
        if (fUseInvs == 0) {
          pFanout = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        else {
          pFanout = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
        }
        iVar1 = Abc_ObjFanoutNum(pObj);
        vNodes = Vec_PtrAlloc(iVar1);
        Abc_NodeCollectFanouts(pObj,vNodes);
        for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
          pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
          Abc_ObjPatchFanin(pAVar3,pObj,pFanout);
        }
        Vec_PtrFree(vNodes);
        Abc_ObjAddFanin(pFanout,pObj);
        iVar1 = Abc_SclComputeReverseLevel(pFanout);
        *(uint *)&pFanout->field_0x14 = *(uint *)&pFanout->field_0x14 & 0xfff | iVar1 << 0xc;
        if (fUseInvs != 0) {
          Abc_NodeInvUpdateFanPolarity(pFanout);
        }
      }
      iVar1 = Abc_SclComputeReverseLevel(pObj);
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | iVar1 << 0xc;
    }
  }
  return;
}

Assistant:

void Abc_SclPerformBuffering_rec( Abc_Obj_t * pObj, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer;
    Abc_Obj_t * pFanout;
    int i, nOldFanNum;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->Level = 0;
    if ( Abc_ObjIsCo(pObj) )
        return;
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // buffer fanouts and collect reverse levels
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_SclPerformBuffering_rec( pFanout, DegreeR, Degree, fUseInvs, fVerbose );
    // perform buffering as long as needed
    nOldFanNum = Abc_ObjFanoutNum(pObj);
    while ( Abc_ObjFanoutNum(pObj) > Degree )
        Abc_SclPerformBufferingOne( pObj, Degree, fUseInvs, fVerbose );
    // add yet another level of buffers
    if ( DegreeR && nOldFanNum > DegreeR )
    {
        if ( fUseInvs )
            pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
        else
            pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
        vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
        Abc_NodeCollectFanouts( pObj, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        Vec_PtrFree( vFanouts );
        Abc_ObjAddFanin( pBuffer, pObj );
        pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
        if ( fUseInvs )
            Abc_NodeInvUpdateFanPolarity( pBuffer );
    }
    // compute the new level of the node
    pObj->Level = Abc_SclComputeReverseLevel( pObj );
}